

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O3

void __thiscall mocker::Annotator::operator()(Annotator *this,FuncCallExpr *node)

{
  pointer psVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  int iVar6;
  mapped_type *pmVar7;
  pointer psVar8;
  mapped_type *pmVar9;
  CompileError *pCVar10;
  mapped_type *pmVar11;
  UnresolvableSymbol *this_02;
  ulong uVar12;
  long lVar13;
  shared_ptr<mocker::ast::FuncDecl> funcDecl;
  SymTbl local_58;
  VisitorBase<false,_true> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  FuncCallExpr *local_38;
  
  setInstance(this,node);
  getFuncDecl((Annotator *)&stack0xffffffffffffffb8,(FuncCallExpr *)this);
  if (local_48._vptr_VisitorBase == (_func_int **)0x0) {
    this_02 = (UnresolvableSymbol *)__cxa_allocate_exception(0x68);
    local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (node->identifier).super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    pmVar11 = std::
              unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
              ::at(this->pos,(key_type *)&local_58);
    UnresolvableSymbol::UnresolvableSymbol
              (this_02,&pmVar11->first,&pmVar11->second,
               &((node->identifier).
                 super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                val);
    __cxa_throw(this_02,&UnresolvableSymbol::typeinfo,UnresolvableSymbol::~UnresolvableSymbol);
  }
  local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (node->identifier).super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  pmVar7 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->ctx->associatedDecl,(key_type *)&local_58);
  (pmVar7->super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)local_48._vptr_VisitorBase;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar7->super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,&stack0xffffffffffffffc0);
  psVar8 = (node->args).
           super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (node->args).
           super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)psVar1 - (long)psVar8 !=
      (long)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_48._vptr_VisitorBase + 0x40))
            ->_M_pi -
      (long)(((enable_shared_from_this<mocker::ast::ASTNode> *)
             ((long)local_48._vptr_VisitorBase + 0x38))->_M_weak_this).
            super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    pCVar10 = (CompileError *)__cxa_allocate_exception(0x48);
    local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)node;
    pmVar11 = std::
              unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
              ::at(this->pos,(key_type *)&local_58);
    CompileError::CompileError(pCVar10,pmVar11->first,pmVar11->second);
    *(undefined ***)pCVar10 = &PTR__CompileError_001eca60;
    __cxa_throw(pCVar10,&InvalidFunctionCall::typeinfo,CompileError::~CompileError);
  }
  if (psVar1 != psVar8) {
    lVar13 = 0;
    uVar12 = 0;
    do {
      local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            ((long)&(psVar8->super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr + lVar13);
      local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)&(psVar8->super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount._M_pi + lVar13);
      if (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      visit(this,(shared_ptr<mocker::ast::ASTNode> *)&local_58);
      if (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.root.
                   super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      lVar2 = *(long *)((long)&((((enable_shared_from_this<mocker::ast::ASTNode> *)
                                 (local_48._vptr_VisitorBase + 7))->_M_weak_this).
                                super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->_vptr_ASTNode + lVar13);
      local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            ((long)&(((node->args).
                      super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            + lVar13);
      pmVar9 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->ctx->exprType,(key_type *)&local_58);
      bVar5 = assignable(this,(shared_ptr<mocker::ast::Type> *)(lVar2 + 0x18),pmVar9);
      if (!bVar5) {
        pCVar10 = (CompileError *)__cxa_allocate_exception(0x48);
        local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)node;
        pmVar11 = std::
                  unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                  ::at(this->pos,(key_type *)&local_58);
        CompileError::CompileError(pCVar10,pmVar11->first,pmVar11->second);
        *(undefined ***)pCVar10 = &PTR__CompileError_001eca60;
        __cxa_throw(pCVar10,&InvalidFunctionCall::typeinfo,CompileError::~CompileError);
      }
      uVar12 = uVar12 + 1;
      psVar8 = (node->args).
               super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x10;
    } while (uVar12 < (ulong)((long)(node->args).
                                    super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4))
    ;
  }
  iVar6 = std::__cxx11::string::compare
                    ((char *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                              (local_48._vptr_VisitorBase + 5))->_M_pi[1]._M_use_count);
  if (iVar6 != 0) {
    local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)node;
    pmVar9 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->ctx->exprType,(key_type *)&local_58);
    (pmVar9->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)
         (((element_type *)((long)local_48._vptr_VisitorBase + 0x18))->super_ASTNode)._vptr_ASTNode;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar9->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_48._vptr_VisitorBase + 0x20));
    goto LAB_0018c97d;
  }
  SymTbl::lookUp(&local_58,(ScopeID *)&this->ctx->syms,(string *)&this->scopeResiding);
  this_01._M_pi =
       local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  peVar3 = local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_0018c91c;
    }
    else {
      (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
LAB_0018c91c:
  std::__shared_ptr<mocker::ast::UserDefinedType,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<mocker::ast::UserDefinedType>,std::shared_ptr<mocker::ast::Identifier>&>
            ((__shared_ptr<mocker::ast::UserDefinedType,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (allocator<mocker::ast::UserDefinedType> *)&stack0xffffffffffffffc8,
             (shared_ptr<mocker::ast::Identifier> *)&(peVar3->syms)._M_h._M_element_count);
  local_38 = node;
  pmVar9 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->ctx->exprType,(key_type *)&stack0xffffffffffffffc8);
  _Var4._M_pi = local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar3 = local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (pmVar9->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  (pmVar9->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)peVar3;
  (pmVar9->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var4._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
LAB_0018c97d:
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  return;
}

Assistant:

void operator()(ast::FuncCallExpr &node) const override {
    setInstance(node);
    auto funcDecl = getFuncDecl(node);
    if (!funcDecl)
      throw UnresolvableSymbol(pos.at(node.identifier->getID()),
                               node.identifier->val);

    ctx.associatedDecl[node.identifier->getID()] = funcDecl;

    if (node.args.size() != funcDecl->formalParameters.size())
      throw InvalidFunctionCall(pos.at(node.getID()));
    for (std::size_t i = 0; i < node.args.size(); ++i) {
      visit(node.args[i]);
      if (!assignable(funcDecl->formalParameters[i]->type,
                      ctx.exprType[node.args[i]->getID()]))
        throw InvalidFunctionCall(pos.at(node.getID()));
    }

    if (funcDecl->identifier->val == "_ctor_") {
      auto decl = std::static_pointer_cast<ast::ClassDecl>(
          ctx.syms.lookUp(scopeResiding, node.identifier->val));
      ctx.exprType[node.getID()] =
          std::make_shared<ast::UserDefinedType>(decl->identifier);
    } else {
      ctx.exprType[node.getID()] = funcDecl->retType;
    }
  }